

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

void __thiscall
icu_63::UCharCharacterIterator::setText
          (UCharCharacterIterator *this,ConstChar16Ptr *newText,int32_t newTextLength)

{
  char16_t *pcVar1;
  int32_t local_1c;
  int32_t newTextLength_local;
  ConstChar16Ptr *newText_local;
  UCharCharacterIterator *this_local;
  
  pcVar1 = ConstChar16Ptr::operator_cast_to_char16_t_(newText);
  this->text = pcVar1;
  pcVar1 = ConstChar16Ptr::operator_cast_to_char16_t_(newText);
  if ((pcVar1 == (char16_t *)0x0) || (local_1c = newTextLength, newTextLength < 0)) {
    local_1c = 0;
  }
  (this->super_CharacterIterator).textLength = local_1c;
  (this->super_CharacterIterator).end = local_1c;
  (this->super_CharacterIterator).begin = 0;
  (this->super_CharacterIterator).pos = 0;
  return;
}

Assistant:

void UCharCharacterIterator::setText(ConstChar16Ptr newText,
                                     int32_t      newTextLength) {
    text = newText;
    if(newText == 0 || newTextLength < 0) {
        newTextLength = 0;
    }
    end = textLength = newTextLength;
    pos = begin = 0;
}